

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::type(Forth *this)

{
  uint uVar1;
  Char local_1d;
  uint local_1c;
  char ch;
  ulong uStack_18;
  CAddr caddr;
  streamsize length;
  Forth *this_local;
  
  length = (streamsize)this;
  requireDStackDepth(this,2,"TYPE");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  uStack_18 = (ulong)uVar1;
  pop(this);
  local_1c = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  while (uVar1 = local_1c, 0 < (long)uStack_18) {
    local_1c = local_1c + 1;
    uStack_18 = uStack_18 - 1;
    local_1d = dataSpaceAt(this,uVar1);
    if (this->writeToTarget == ToString) {
      std::ostream::write(&this->field_0x20,(long)&local_1d);
    }
    else if (this->writeToTarget == ToStdCout) {
      std::ostream::write((char *)&std::cout,(long)&local_1d);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void type() {
			REQUIRE_DSTACK_DEPTH(2, "TYPE");
			auto length = static_cast<std::streamsize>(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop()); pop();
			while (length-- > 0){
				char ch = dataSpaceAt(caddr++);
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
				switch (writeToTarget) {
				case ToString:
					std_cout.write(&ch, 1);
					break;
				case ToStdCout:
					std::cout.write(&ch, 1);
				    std::cout.flush();
					break;
				default:
					break;
				}
#endif
			}
		}